

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  ImGuiTable *pIVar2;
  ImGuiTableCellData *pIVar3;
  ImU32 IVar4;
  short sVar5;
  
  pIVar2 = GImGui->CurrentTable;
  IVar4 = 0;
  if (color != 0x1000000) {
    IVar4 = color;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar2->InnerClipRect).Max.y;
    if (pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1) {
      pIVar2->RowBgColor[target == 2] = IVar4;
    }
  }
  else if ((target == 3) &&
          (pfVar1 = &(pIVar2->InnerClipRect).Max.y,
          pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1)) {
    if (column_n == -1) {
      column_n = pIVar2->CurrentColumn;
    }
    if ((pIVar2->VisibleMaskByIndex[column_n >> 5] >> (column_n & 0x1fU) & 1) != 0) {
      sVar5 = pIVar2->RowCellDataCurrent;
      pIVar3 = (pIVar2->RowCellData).Data;
      if (((long)sVar5 < 0) || (column_n != pIVar3[sVar5].Column)) {
        sVar5 = sVar5 + 1;
        pIVar2->RowCellDataCurrent = sVar5;
      }
      pIVar3[sVar5].BgColor = IVar4;
      pIVar3[sVar5].Column = (ImGuiTableColumnIdx)column_n;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if (!IM_BITARRAY_TESTBIT(table->VisibleMaskByIndex, column_n))
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}